

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateBlockBuilder.cpp
# Opt level: O2

AppStatePtr MakeState_BlockBuilder(void)

{
  _Impl *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  pointer __first;
  pointer __last;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  pointer __result;
  long lVar5;
  pointer pHVar6;
  undefined8 *puVar7;
  _Tp_alloc_type *__alloc;
  char *__s;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t __n;
  element_type *in_RDI;
  pointer pHVar8;
  AppStatePtr AVar9;
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  _Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  *local_118;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::StateBlockBuilder,_std::allocator<(anonymous_namespace)::StateBlockBuilder>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_110;
  _Alloc_hider local_100;
  _Tp_alloc_type *local_f8;
  char local_f0;
  undefined7 uStack_ef;
  undefined8 uStack_e8;
  undefined1 local_e0 [116];
  undefined4 local_6c;
  vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  local_68;
  undefined8 local_50;
  vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  local_48;
  
  _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x340);
  local_110._M_alloc = &__a2;
  (((pointer)_Var4._M_pi)->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (((pointer)_Var4._M_pi)->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (((pointer)_Var4._M_pi)->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>).
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001d8fc0;
  p_Var1 = &((pointer)_Var4._M_pi)->_M_impl;
  (((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage.__data[8] = '\0';
  *(undefined8 *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x10) = 0;
  *(undefined8 *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x18) = 0;
  (((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__StateBlockBuilder_001d9010;
  local_110._M_ptr = (pointer)_Var4._M_pi;
  LayoutBlockBuilder::LayoutBlockBuilder
            ((LayoutBlockBuilder *)
             ((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x20));
  memset((void *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x268),0,0x99);
  *(undefined4 *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x304) = 3;
  *(undefined8 *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x308) = 0;
  *(undefined8 *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x310) = 0;
  *(undefined8 *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x318) = 0;
  *(undefined8 *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 800) = 0;
  *(undefined8 *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x328) = 0;
  memset(&local_100,0,0x91);
  local_50 = 0;
  local_6c = 3;
  memcpy((void *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x1b8),&local_100
         ,0x98);
  *(undefined8 *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x250) = 0;
  *(undefined8 *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 600) = 0;
  *(undefined8 *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x260) = 0;
  local_48.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ::~vector(&local_48);
  *(undefined8 *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x268) = 0;
  std::
  vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ::~vector(&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"empty",(allocator<char> *)&local_48);
  __n = 0;
  memset(local_e0,0,0x91);
  local_50 = CONCAT44(3,(undefined4)local_50);
  pHVar8 = *(pointer *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 600);
  if (pHVar8 == *(pointer *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x260)
     ) {
    local_118 = (_Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
                 *)std::
                   vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
                   ::_M_check_len((vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
                                   *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage
                                     + 0x250),__n,__s);
    __first = *(pointer *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x250);
    __last = *(pointer *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 600);
    __result = std::
               _Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
               ::_M_allocate(local_118,__n);
    __alloc = local_f8;
    lVar5 = (long)pHVar8 - (long)__first;
    puVar3 = (undefined8 *)((long)__result + lVar5);
    puVar7 = (undefined8 *)((long)__result + lVar5 + 0x10);
    *(undefined8 **)((long)__result + lVar5) = puVar7;
    if (local_100._M_p == &local_f0) {
      *puVar7 = CONCAT71(uStack_ef,local_f0);
      *(undefined8 *)((long)__result + lVar5 + 0x18) = uStack_e8;
    }
    else {
      *puVar3 = local_100._M_p;
      puVar3[2] = CONCAT71(uStack_ef,local_f0);
    }
    local_f8 = (_Tp_alloc_type *)0x0;
    puVar3[1] = __alloc;
    local_f0 = '\0';
    local_100._M_p = &local_f0;
    memcpy(puVar3 + 4,local_e0,0x98);
    pHVar6 = std::
             vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
             ::_S_relocate(__first,pHVar8,__result,__alloc);
    pHVar8 = std::
             vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
             ::_S_relocate(pHVar8,__last,pHVar6 + 1,__alloc);
    lVar5 = *(long *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x260) -
            (long)__first;
    std::
    _Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
    ::_M_deallocate((_Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
                     *)__first,(pointer)(lVar5 / 0xb8),lVar5 % 0xb8);
    *(pointer *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x250) = __result;
    *(pointer *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x260) =
         __result + (long)local_118;
  }
  else {
    paVar2 = &(pHVar8->label).field_2;
    (pHVar8->label)._M_dataplus._M_p = (pointer)paVar2;
    if (local_100._M_p == &local_f0) {
      paVar2->_M_allocated_capacity = CONCAT71(uStack_ef,local_f0);
      *(undefined8 *)((long)&(pHVar8->label).field_2 + 8) = uStack_e8;
    }
    else {
      (pHVar8->label)._M_dataplus._M_p = local_100._M_p;
      (pHVar8->label).field_2._M_allocated_capacity = CONCAT71(uStack_ef,local_f0);
    }
    (pHVar8->label)._M_string_length = (size_type)local_f8;
    local_f8 = (_Tp_alloc_type *)0x0;
    local_f0 = '\0';
    local_100._M_p = &local_f0;
    memcpy(&pHVar8->block,local_e0,0x98);
    pHVar8 = (pointer)(*(long *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage +
                                600) + 0xb8);
  }
  *(pointer *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 600) = pHVar8;
  std::__cxx11::string::~string((string *)&local_100);
  *(undefined4 *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x304) = 0;
  local_110._M_ptr = (pointer)0x0;
  _Stack_120._M_pi = _Var4._M_pi;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::StateBlockBuilder,_std::allocator<(anonymous_namespace)::StateBlockBuilder>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_110);
  lVar5 = *(long *)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x18);
  if ((lVar5 == 0) || (*(int *)(lVar5 + 8) == 0)) {
    *(_Impl **)((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x10) = p_Var1;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((pointer)_Var4._M_pi)->_M_impl)._M_storage._M_storage + 0x18),&_Stack_120);
    _Var4._M_pi = _Stack_120._M_pi;
  }
  _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI->_vptr_AppState = (_func_int **)p_Var1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&in_RDI->m_completed = _Var4._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_120);
  AVar9.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  AVar9.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (AppStatePtr)AVar9.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AppStatePtr MakeState_BlockBuilder()
{
    return std::make_shared<StateBlockBuilder>();
}